

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>
::_initialize_U(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_false,_true>_>_>
                *this)

{
  ID_index i;
  uint uVar1;
  uint local_3c;
  initializer_list<unsigned_int> local_38;
  
  for (uVar1 = 0; uVar1 < (uint)(this->reducedMatrixR_).matrix_._M_h._M_element_count;
      uVar1 = uVar1 + 1) {
    local_38._M_len = 1;
    local_3c = uVar1;
    local_38._M_array = &local_3c;
    Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,true>>>
    ::insert_column<std::initializer_list<unsigned_int>>
              ((Base_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,false,true>>>
                *)&this->mirrorMatrixU_,&local_38);
  }
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_initialize_U()
{
  typename std::conditional<Master_matrix::Option_list::is_z2, Index, std::pair<Index, Field_element> >::type id;
  if constexpr (!Master_matrix::Option_list::is_z2) id.second = 1;

  for (ID_index i = 0; i < reducedMatrixR_.get_number_of_columns(); i++) {
    if constexpr (Master_matrix::Option_list::is_z2)
      id = i;
    else
      id.first = i;
    mirrorMatrixU_.insert_column({id});
  }
}